

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlSearchNsSafe(xmlNodePtr node,xmlChar *prefix,xmlNsPtr *out)

{
  xmlDocPtr doc;
  int iVar1;
  xmlNsPtr pxVar2;
  _xmlNode *p_Var3;
  xmlNodePtr orig;
  _xmlNode *p_Var4;
  
  if (out == (xmlNsPtr *)0x0) {
    return 1;
  }
  *out = (xmlNsPtr)0x0;
  if (node == (xmlNodePtr)0x0) {
    return 1;
  }
  if (node->type == XML_NAMESPACE_DECL) {
    return 1;
  }
  doc = node->doc;
  p_Var3 = node;
  if ((((prefix == (xmlChar *)0x0 || doc == (xmlDocPtr)0x0) || (*prefix != 'x')) ||
      (prefix[1] != 'm')) || ((prefix[2] != 'l' || (prefix[3] != '\0')))) {
    while (p_Var4 = p_Var3, p_Var3->type != XML_ELEMENT_NODE) {
      p_Var3 = p_Var3->parent;
      if (p_Var3 == (_xmlNode *)0x0) {
        return 0;
      }
    }
    for (; (p_Var4 != (xmlNodePtr)0x0 && (p_Var4->type == XML_ELEMENT_NODE));
        p_Var4 = p_Var4->parent) {
      pxVar2 = (xmlNsPtr)&p_Var4->nsDef;
      while (pxVar2 = pxVar2->next, pxVar2 != (xmlNsPtr)0x0) {
        iVar1 = xmlStrEqual(pxVar2->prefix,prefix);
        if ((iVar1 != 0) && (pxVar2->href != (xmlChar *)0x0)) goto LAB_00148cf3;
      }
      if ((p_Var4 != node) &&
         (((pxVar2 = p_Var4->ns, pxVar2 != (xmlNsPtr)0x0 &&
           (iVar1 = xmlStrEqual(pxVar2->prefix,prefix), iVar1 != 0)) &&
          (pxVar2->href != (xmlChar *)0x0)))) goto LAB_00148cf3;
    }
    if (doc != (xmlDocPtr)0x0 || prefix == (xmlChar *)0x0) {
      return 0;
    }
    if (*prefix != 'x') {
      return 0;
    }
    if (prefix[1] != 'm') {
      return 0;
    }
    if (prefix[2] != 'l') {
      return 0;
    }
    if (prefix[3] != '\0') {
      return 0;
    }
    pxVar2 = xmlNewXmlNs();
    if (pxVar2 == (xmlNsPtr)0x0) {
      return -1;
    }
    pxVar2->next = p_Var3->nsDef;
    p_Var3->nsDef = pxVar2;
  }
  else {
    pxVar2 = xmlTreeEnsureXMLDecl(doc);
    if (pxVar2 == (xmlNsPtr)0x0) {
      return -1;
    }
  }
LAB_00148cf3:
  *out = pxVar2;
  return 0;
}

Assistant:

int
xmlSearchNsSafe(xmlNodePtr node, const xmlChar *prefix,
                xmlNsPtr *out) {
    xmlNsPtr cur;
    xmlDocPtr doc;
    xmlNodePtr orig = node;
    xmlNodePtr parent;

    if (out == NULL)
        return(1);
    *out = NULL;
    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL))
        return(1);

    doc = node->doc;

    if ((doc != NULL) && (IS_STR_XML(prefix))) {
        cur = xmlTreeEnsureXMLDecl(doc);
        if (cur == NULL)
            return(-1);
        *out = cur;
        return(0);
    }

    while (node->type != XML_ELEMENT_NODE) {
        node = node->parent;
        if (node == NULL)
            return(0);
    }

    parent = node;

    while ((node != NULL) && (node->type == XML_ELEMENT_NODE)) {
        cur = node->nsDef;
        while (cur != NULL) {
            if ((xmlStrEqual(cur->prefix, prefix)) &&
                (cur->href != NULL)) {
                *out = cur;
                return(0);
            }
            cur = cur->next;
        }
        if (orig != node) {
            cur = node->ns;
            if ((cur != NULL) &&
                (xmlStrEqual(cur->prefix, prefix)) &&
                (cur->href != NULL)) {
                *out = cur;
                return(0);
            }
        }

	node = node->parent;
    }

    /*
     * The XML-1.0 namespace is normally held on the document
     * element. In this case exceptionally create it on the
     * node element.
     */
    if ((doc == NULL) && (IS_STR_XML(prefix))) {
        cur = xmlNewXmlNs();
        if (cur == NULL)
            return(-1);
        cur->next = parent->nsDef;
        parent->nsDef = cur;
        *out = cur;
    }

    return(0);
}